

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O3

void __thiscall Polynom<Finite>::strip(Polynom<Finite> *this)

{
  pointer *ppuVar1;
  ulong uVar2;
  uint uVar3;
  Matrix<Finite> local_20;
  
  uVar3 = (this->m).N - 1;
  if (uVar3 != 0) {
    ppuVar1 = &(((this->m).arr)->val).digits.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar2 = 0;
    do {
      if (((_Vector_impl_data *)(ppuVar1 + -1))->_M_start != *ppuVar1) goto LAB_001401a4;
      uVar2 = uVar2 + 1;
      ppuVar1 = ppuVar1 + 4;
    } while (uVar3 != uVar2);
    uVar2 = (ulong)uVar3;
LAB_001401a4:
    if ((uint)uVar2 != 0) {
      Matrix<Finite>::submatrix(&local_20,(uint)this,0,(uint)uVar2,0);
      Matrix<Finite>::operator=(&this->m,&local_20);
      Matrix<Finite>::~Matrix(&local_20);
    }
  }
  return;
}

Assistant:

void Polynom<Field>::strip()
{
    unsigned p = 0;
    while(p < m.width() - 1 && !m[0][p])
        ++p;
    if(p)
        m = m.submatrix(0, p, 0, m.width() - 1);
}